

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

IVal * deqp::gls::BuiltinPrecisionTests::
       ContainerTraits<tcu::Matrix<float,_4,_2>,_tcu::Matrix<tcu::Interval,_4,_2>_>::doRound
                 (IVal *__return_storage_ptr__,FloatFormat *fmt,Matrix<float,_4,_2> *value)

{
  Matrix<float,_4,_2> *this;
  FloatFormat *fmt_00;
  Vector<tcu::Interval,_4> *__dest;
  Vector<float,_4> *in_RCX;
  IVal local_88;
  int local_28;
  undefined1 local_21;
  int ndx;
  Matrix<float,_4,_2> *value_local;
  FloatFormat *fmt_local;
  IVal *ret;
  
  local_21 = 0;
  _ndx = value;
  value_local = (Matrix<float,_4,_2> *)fmt;
  fmt_local = (FloatFormat *)__return_storage_ptr__;
  tcu::Matrix<tcu::Interval,_4,_2>::Matrix(__return_storage_ptr__);
  for (local_28 = 0; this = value_local, local_28 < 2; local_28 = local_28 + 1) {
    fmt_00 = (FloatFormat *)tcu::Matrix<float,_4,_2>::operator[](value,local_28);
    round<tcu::Vector<float,4>>(&local_88,(BuiltinPrecisionTests *)this,fmt_00,in_RCX);
    __dest = tcu::Matrix<tcu::Interval,_4,_2>::operator[](__return_storage_ptr__,local_28);
    memcpy(__dest,&local_88,0x60);
  }
  return __return_storage_ptr__;
}

Assistant:

static IVal			doRound			(const FloatFormat& fmt, T value)
	{
		IVal ret;

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			ret[ndx] = round(fmt, value[ndx]);

		return ret;
	}